

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator=
          (RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *this,
          PipelineResourceSignatureGLImpl *pObj)

{
  PipelineResourceSignatureGLImpl *this_00;
  char (*in_RCX) [26];
  string msg;
  string local_30;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (PipelineResourceSignatureGLImpl *)0x0) {
      DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      ::Release((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                 *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (PipelineResourceSignatureGLImpl *)0x0) {
      if ((pObj->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
          .super_ObjectBase<Diligent::IPipelineResourceSignature>.
          super_RefCountedObject<Diligent::IPipelineResourceSignature>.m_pRefCounters ==
          (RefCountersImpl *)0x0) {
        FormatString<char[26],char[26]>
                  (&local_30,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
        DebugAssertionFailed
                  (local_30._M_dataplus._M_p,"AddRef",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                   ,0x221);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
      }
      RefCountersImpl::AddStrongRef
                ((pObj->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                 .super_ObjectBase<Diligent::IPipelineResourceSignature>.
                 super_RefCountedObject<Diligent::IPipelineResourceSignature>.m_pRefCounters);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }